

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*> __thiscall
fmt::v7::detail::format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  uint uVar3;
  int in_ECX;
  undefined4 in_register_00000014;
  undefined1 auVar4 [16];
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  detail *dst;
  char *end;
  char cStack_48;
  int size_local;
  unsigned___int128 value_local;
  detail *local_30;
  char *out_local;
  detail *local_18;
  
  value_local._0_8_ = CONCAT44(in_register_00000014,size);
  auVar4._8_8_ = in_stack_ffffffffffffff70;
  auVar4._0_8_ = in_stack_ffffffffffffff68;
  iVar2 = count_digits((detail *)out,(uint128_t)auVar4);
  if (iVar2 <= in_ECX) {
    _cStack_48 = out;
    local_30 = this + in_ECX;
    while ((_cStack_48 < (char *)0x64) <= (ulong)value_local) {
      local_30 = local_30 + -2;
      dst = local_30;
      uVar3 = __umodti3(_cStack_48,(ulong)value_local);
      copy2((char *)dst,basic_data<void>::digits + (ulong)uVar3 * 2);
      auVar4 = __udivti3(_cStack_48,(ulong)value_local,100,0);
      value_local._0_8_ = auVar4._8_8_;
      _cStack_48 = auVar4._0_8_;
    }
    if ((ulong)value_local == 0 && (ulong)((char *)0x9 < _cStack_48) <= -(ulong)value_local) {
      local_18 = local_30 + -1;
      local_30[-1] = (detail)(cStack_48 + '0');
    }
    else {
      local_18 = local_30 + -2;
      copy2((char *)local_18,basic_data<void>::digits + (long)_cStack_48 * 2);
    }
    fVar1.end = (char *)(this + in_ECX);
    fVar1.begin = (char *)local_18;
    return fVar1;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/fmt/include/fmt/format.h"
              ,0x39c,"invalid digit count");
}

Assistant:

inline format_decimal_result<Char*> format_decimal(Char* out, UInt value,
                                                   int size) {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}